

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
          (endpoint<websocketpp::config::asio::transport_config> *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int iVar2;
  size_t in_RCX;
  error_code eVar3;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"transport::asio::init",in_RCX);
  lVar1 = *(long *)(ctx + 8);
  local_78 = *(undefined8 *)ctx;
  p_Stack_70 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 8);
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  basic_socket::endpoint::init(&this->super_socket_type,(EVP_PKEY_CTX *)&local_78);
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  eVar3 = connection<websocketpp::config::asio::transport_config>::init_asio
                    (*(connection<websocketpp::config::asio::transport_config> **)ctx,
                     this->m_io_service);
  iVar2 = eVar3._M_value;
  if (iVar2 == 0) {
    lVar1 = *(long *)ctx;
    std::function<void_(std::weak_ptr<void>)>::function
              ((function<void_(std::weak_ptr<void>)> *)&local_48,&this->m_tcp_pre_init_handler);
    std::function<void_(std::weak_ptr<void>)>::operator=
              ((function<void_(std::weak_ptr<void>)> *)(lVar1 + 0x100),
               (function<void_(std::weak_ptr<void>)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    lVar1 = *(long *)ctx;
    std::function<void_(std::weak_ptr<void>)>::function
              ((function<void_(std::weak_ptr<void>)> *)&local_68,&this->m_tcp_post_init_handler);
    std::function<void_(std::weak_ptr<void>)>::operator=
              ((function<void_(std::weak_ptr<void>)> *)(lVar1 + 0x120),
               (function<void_(std::weak_ptr<void>)> *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    iVar2 = 0;
    std::_V2::system_category();
  }
  return iVar2;
}

Assistant:

lib::error_code init(transport_con_ptr tcon) {
        m_alog->write(log::alevel::devel, "transport::asio::init");

        // Initialize the connection socket component
        socket_type::init(lib::static_pointer_cast<socket_con_type,
            transport_con_type>(tcon));

        lib::error_code ec;

        ec = tcon->init_asio(m_io_service);
        if (ec) {return ec;}

        tcon->set_tcp_pre_init_handler(m_tcp_pre_init_handler);
        tcon->set_tcp_post_init_handler(m_tcp_post_init_handler);

        return lib::error_code();
    }